

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_DropItem
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *source;
  PClassActor *type;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  VMValue *pVVar4;
  PClassActor *pPVar5;
  char *pcVar6;
  bool bVar7;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      source = (AActor *)(param->field_0).field_1.a;
      if (source != (AActor *)0x0) {
        if ((source->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
          (source->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (source->super_DThinker).super_DObject.Class;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar7) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar7 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003dcee6;
        }
      }
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          type = (PClassActor *)param[1].field_0.field_1.a;
          if ((type != (PClassActor *)0x0) &&
             (pPVar5 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
              if (pPVar5 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
            } while (pPVar5 != (PClassActor *)0x0);
            if (pPVar5 == (PClassActor *)0x0) {
              pcVar6 = "spawntype == NULL || spawntype->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_003dcf43;
            }
          }
          if (numparam < 3) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[2].field_0.field_3.Type != '\0') {
              pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003dcf05;
            }
          }
          else {
            pVVar4 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003dcf05:
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1677,
                            "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 4) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type == '\0') goto LAB_003dcea5;
            pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
LAB_003dcea5:
              P_DropItem(source,type,pVVar4[2].field_0.i,param[3].field_0.i);
              return 0;
            }
            pcVar6 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1678,
                        "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar6 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003dcf43:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1676,
                    "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003dcee6:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1675,
                "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DropItem)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS   (spawntype, AActor);
	PARAM_INT_DEF(amount);
	PARAM_INT_DEF(chance);

	P_DropItem(self, spawntype, amount, chance);
	return 0;
}